

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::initiatorFixtureTagAppearsMoreThanOnce_RejectedHelper::
~initiatorFixtureTagAppearsMoreThanOnce_RejectedHelper
          (initiatorFixtureTagAppearsMoreThanOnce_RejectedHelper *this)

{
  sessionFixture::~sessionFixture((sessionFixture *)&this[-1].m_details);
  operator_delete(&this[-1].m_details,0x630);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, TagAppearsMoreThanOnce_Rejected)
{
  startLoggedOn();

  FIX42::NewOrderSingle newOrderSingle = createNewOrderSingle( "ISLD", "TW", 2 );
  newOrderSingle.setField(Symbol("1stAppearance"));
  newOrderSingle.setField(Symbol("2ndAppearance"), false);

  object->next( newOrderSingle, UtcTimeStamp() );
  CHECK_EQUAL(1, toReject);
}